

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_column_removal<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
               (void)

{
  Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
  *this;
  uint uVar1;
  mapped_type mVar2;
  _Hash_node_base *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  mapped_type *pmVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  uint uVar13;
  const_iterator __end0;
  const_iterator __begin0;
  undefined1 auVar14 [8];
  pointer witness;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_> m;
  uint local_340 [2];
  undefined8 local_338;
  shared_count sStack_330;
  undefined1 local_328 [8];
  mapped_type *pmStack_320;
  _Base_ptr local_318;
  char *local_310;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_2f0;
  undefined1 local_2d8 [64];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_298;
  bool local_260;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_258;
  uint local_220;
  pool<boost::default_user_allocator_malloc_free> *local_218;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
            ();
  local_2d8._0_8_ = operator_new(0x38);
  (((Entry_constructor *)
   &((pool<boost::default_user_allocator_malloc_free> *)local_2d8._0_8_)->
    super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_2d8._0_8_)->list).ptr = (char *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_2d8._0_8_)->list).sz = 0;
  ((pool<boost::default_user_allocator_malloc_free> *)local_2d8._0_8_)->requested_size = 0x18;
  ((pool<boost::default_user_allocator_malloc_free> *)local_2d8._0_8_)->next_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_2d8._0_8_)->start_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_2d8._0_8_)->max_size = 0;
  this = (Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
          *)(local_2d8 + 8);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
  ::Base_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
              *)this,&local_2f0,(Column_settings *)local_2d8._0_8_);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
            (&local_2f0,
             (Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_> *)
             local_2d8);
  local_328._0_4_ = 2;
  if (local_220 == 3) {
    local_220 = 2;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(local_2d8 + 0x80),local_328);
  local_328._0_4_ = 4;
  if (local_220 == 5) {
    local_220 = 4;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(local_2d8 + 0x80),local_328);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x341);
  if (local_260 == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
    ::_orderRows(this);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_258._M_bucket_count;
  uVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar4,0);
  if (local_258._M_buckets[uVar12 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var3 = local_258._M_buckets[uVar12 & 0xffffffff]->_M_nxt;
    uVar13 = *(uint *)&p_Var3[1]._M_nxt;
    do {
      if (uVar13 == 2) {
        local_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_58 = "";
        local_70 = &boost::unit_test::basic_cstring<char_const>::null;
        local_68 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x341);
        local_340[0] = local_340[0] & 0xffffff00;
        local_338 = 0;
        sStack_330.pi_ = (sp_counted_base *)0x0;
        pmStack_320 = (mapped_type *)((ulong)pmStack_320 & 0xffffffffffffff00);
        local_328 = (undefined1  [8])&PTR__lazy_ostream_001b8810;
        local_318 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_310 = "exception std::logic_error expected but not raised";
        local_80 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_78 = "";
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_330);
        local_c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_b8 = "";
        local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x342);
        if (local_260 == true) {
          Gudhi::persistence_matrix::
          Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
          ::_orderRows(this);
        }
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_258._M_bucket_count;
        uVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar5,0);
        if (local_258._M_buckets[uVar12 & 0xffffffff] != (__node_base_ptr)0x0) {
          p_Var3 = local_258._M_buckets[uVar12 & 0xffffffff]->_M_nxt;
          uVar13 = *(uint *)&p_Var3[1]._M_nxt;
          do {
            if (uVar13 == 4) {
              local_e0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_d8 = "";
              local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x342);
              local_340[0] = local_340[0] & 0xffffff00;
              local_338 = 0;
              sStack_330.pi_ = (sp_counted_base *)0x0;
              pmStack_320 = (mapped_type *)((ulong)pmStack_320 & 0xffffffffffffff00);
              local_328 = (undefined1  [8])&PTR__lazy_ostream_001b8810;
              local_318 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
              local_310 = "exception std::logic_error expected but not raised";
              local_100 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_f8 = "";
              boost::test_tools::tt_detail::report_assertion();
              boost::detail::shared_count::~shared_count(&sStack_330);
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::_M_erase(&local_2f0,
                         local_2f0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::_M_erase(&local_2f0,
                         local_2f0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
              if (local_2f0.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_2f0.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar13 = 0;
                witness = local_2f0.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  if ((uVar13 == 4) || (uVar13 == 2)) {
                    uVar13 = uVar13 | 1;
                  }
                  if (local_260 == true) {
                    Gudhi::persistence_matrix::
                    Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                    ::_orderRows(this);
                  }
                  if (local_258._M_buckets[(ulong)uVar13 % local_258._M_bucket_count] ==
                      (__node_base_ptr)0x0) {
LAB_0016522c:
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var3 = local_258._M_buckets[(ulong)uVar13 % local_258._M_bucket_count]->_M_nxt;
                  uVar1 = *(uint *)&p_Var3[1]._M_nxt;
                  while (uVar13 != uVar1) {
                    p_Var3 = p_Var3->_M_nxt;
                    if ((p_Var3 == (_Hash_node_base *)0x0) ||
                       (uVar1 = *(uint *)&p_Var3[1]._M_nxt,
                       (ulong)uVar1 % local_258._M_bucket_count !=
                       (ulong)uVar13 % local_258._M_bucket_count)) goto LAB_0016522c;
                  }
                  get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
                            ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                              *)local_328,
                             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>
                              *)(p_Var3 + 2));
                  test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
                            (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                                      *)local_328);
                  uVar13 = uVar13 + 1;
                  std::
                  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)local_328);
                  witness = witness + 1;
                } while (witness !=
                         local_2f0.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              local_328 = (undefined1  [8])0x0;
              pmStack_320 = (mapped_type *)0x0;
              local_318 = (_Base_ptr)0x0;
              if (local_220 < 3) {
                local_220 = 3;
              }
              if ((local_260 == true) &&
                 (Gudhi::persistence_matrix::
                  Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                  ::_orderRows(this), pmVar8 = pmStack_320,
                 local_328 != (undefined1  [8])pmStack_320)) {
                auVar14 = local_328;
                do {
                  mVar2 = *(mapped_type *)auVar14;
                  local_340[0] = mVar2;
                  pmVar11 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)this,local_340);
                  uVar13 = local_340[0];
                  *pmVar11 = mVar2;
                  pmVar11 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)(local_2d8 + 0x40),local_340);
                  *pmVar11 = uVar13;
                  auVar14 = (undefined1  [8])((long)auVar14 + 4);
                } while (auVar14 != (undefined1  [8])pmVar8);
              }
              Gudhi::persistence_matrix::
              Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
              ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
                          *)this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_328,2,
                         0);
              if (local_328 != (undefined1  [8])0x0) {
                operator_delete((void *)local_328,(long)local_318 - (long)local_328);
              }
              if (local_260 == true) {
                Gudhi::persistence_matrix::
                Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                ::_orderRows(this);
              }
              auVar6._8_8_ = 0;
              auVar6._0_8_ = local_258._M_bucket_count;
              uVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar6,0);
              if (local_258._M_buckets[uVar12 & 0xffffffff] != (__node_base_ptr)0x0) {
                p_Var3 = local_258._M_buckets[uVar12 & 0xffffffff]->_M_nxt;
                uVar13 = *(uint *)&p_Var3[1]._M_nxt;
                do {
                  if (uVar13 == 2) {
                    local_140 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_138 = "";
                    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,
                               0x34e);
                    local_340[0] = CONCAT31(local_340[0]._1_3_,1);
                    local_338 = 0;
                    sStack_330.pi_ = (sp_counted_base *)0x0;
                    pmStack_320 = (mapped_type *)((ulong)pmStack_320 & 0xffffffffffffff00);
                    local_328 = (undefined1  [8])&PTR__lazy_ostream_001b89d0;
                    local_318 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
                    local_310 = "no exceptions thrown by m.get_column(2)";
                    local_160 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_158 = "";
                    boost::test_tools::tt_detail::report_assertion();
                    boost::detail::shared_count::~shared_count(&sStack_330);
                    local_1a0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_198 = "";
                    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,
                               0x34f);
                    if (local_260 == true) {
                      Gudhi::persistence_matrix::
                      Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                      ::_orderRows(this);
                    }
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = local_258._M_bucket_count;
                    uVar12 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar7,0);
                    if (local_258._M_buckets[uVar12 & 0xffffffff] != (__node_base_ptr)0x0) {
                      p_Var3 = local_258._M_buckets[uVar12 & 0xffffffff]->_M_nxt;
                      uVar13 = *(uint *)&p_Var3[1]._M_nxt;
                      do {
                        if (uVar13 == 4) {
                          local_1c0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_1b8 = "";
                          local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_1c0,0x34f);
                          local_340[0] = local_340[0] & 0xffffff00;
                          local_338 = 0;
                          sStack_330.pi_ = (sp_counted_base *)0x0;
                          pmStack_320 = (mapped_type *)((ulong)pmStack_320 & 0xffffffffffffff00);
                          local_328 = (undefined1  [8])&PTR__lazy_ostream_001b8810;
                          local_318 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
                          local_310 = "exception std::logic_error expected but not raised";
                          local_1e0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_1d8 = "";
                          boost::test_tools::tt_detail::report_assertion();
                          boost::detail::shared_count::~shared_count(&sStack_330);
                          uVar9 = local_2d8._0_8_;
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::clear((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)(local_2d8 + 0x80));
                          uVar10 = local_2d8._0_8_;
                          local_220 = 0;
                          local_218 = (pool<boost::default_user_allocator_malloc_free> *)uVar9;
                          if ((pool<boost::default_user_allocator_malloc_free> *)local_2d8._0_8_ !=
                              (pool<boost::default_user_allocator_malloc_free> *)0x0) {
                            boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                                      ((pool<boost::default_user_allocator_malloc_free> *)
                                       local_2d8._0_8_);
                          }
                          operator_delete((void *)uVar10,0x38);
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                         *)(local_2d8 + 0x80));
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                         *)(local_2d8 + 0x40));
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                         *)this);
                          std::
                          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ::~vector(&local_2f0);
                          return;
                        }
                        p_Var3 = p_Var3->_M_nxt;
                      } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                              (uVar13 = *(uint *)&p_Var3[1]._M_nxt,
                              (ulong)uVar13 % local_258._M_bucket_count == uVar12));
                    }
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var3 = p_Var3->_M_nxt;
                } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                        (uVar13 = *(uint *)&p_Var3[1]._M_nxt,
                        (ulong)uVar13 % local_258._M_bucket_count == uVar12));
              }
              std::__throw_out_of_range("_Map_base::at");
            }
            p_Var3 = p_Var3->_M_nxt;
          } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                  (uVar13 = *(uint *)&p_Var3[1]._M_nxt,
                  (ulong)uVar13 % local_258._M_bucket_count == uVar12));
        }
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var3 = p_Var3->_M_nxt;
    } while ((p_Var3 != (_Hash_node_base *)0x0) &&
            (uVar13 = *(uint *)&p_Var3[1]._M_nxt,
            (ulong)uVar13 % local_258._M_bucket_count == uVar12));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_column_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.remove_column(2);
  m.remove_column(4);
  BOOST_CHECK_THROW(m.get_column(2), std::logic_error);
  BOOST_CHECK_THROW(m.get_column(4), std::logic_error);

  columns.erase(columns.begin() + 4);
  columns.erase(columns.begin() + 2);
  unsigned int i = 0;
  for (auto& b : columns) {
    if (i == 2 || i == 4) ++i;
    test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++)));
  }

  if constexpr (!Matrix::Option_list::has_row_access) {
    m.insert_column(witness_content<typename Matrix::Column>{}, 2);
    BOOST_CHECK_NO_THROW(m.get_column(2));
    BOOST_CHECK_THROW(m.get_column(4), std::logic_error);
  }
}